

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

bool __thiscall
cmCMakePresetsGraph::PackagePreset::VisitPresetInherit(PackagePreset *this,Preset *parentPreset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_node_base *p_Var2;
  
  if ((this->ConfigurePreset)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->ConfigurePreset);
  }
  if ((this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)((long)&parentPreset[1].Name.field_2 + 8);
  }
  if ((this->Generators).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->Generators).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->Generators,&parentPreset[1].Inherits);
  }
  if ((this->Configurations).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->Configurations).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->Configurations,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&parentPreset[1].Hidden);
  }
  p_Var2 = (_Rb_tree_node_base *)parentPreset[1].Description._M_dataplus._M_p;
  paVar1 = &parentPreset[1].DisplayName.field_2;
  if (p_Var2 != (_Rb_tree_node_base *)paVar1) {
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&this->Variables,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(p_Var2 + 1));
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)paVar1);
  }
  if ((this->DebugOutput).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->DebugOutput).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)&parentPreset[1].Environment._M_t._M_impl;
  }
  if ((this->VerboseOutput).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->VerboseOutput).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)&parentPreset[1].Environment._M_t._M_impl.field_0x2;
  }
  if ((this->PackageName)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->PackageName);
  }
  if ((this->PackageVersion)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->PackageVersion);
  }
  if ((this->PackageDirectory)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->PackageDirectory);
  }
  if ((this->VendorName)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->VendorName);
  }
  return true;
}

Assistant:

bool cmCMakePresetsGraph::PackagePreset::VisitPresetInherit(
  const cmCMakePresetsGraph::Preset& parentPreset)
{
  auto& preset = *this;
  const PackagePreset& parent =
    static_cast<const PackagePreset&>(parentPreset);

  InheritString(preset.ConfigurePreset, parent.ConfigurePreset);
  InheritOptionalValue(preset.InheritConfigureEnvironment,
                       parent.InheritConfigureEnvironment);
  InheritVector(preset.Generators, parent.Generators);
  InheritVector(preset.Configurations, parent.Configurations);

  for (auto const& v : parent.Variables) {
    preset.Variables.insert(v);
  }

  InheritOptionalValue(preset.DebugOutput, parent.DebugOutput);
  InheritOptionalValue(preset.VerboseOutput, parent.VerboseOutput);
  InheritString(preset.PackageName, parent.PackageName);
  InheritString(preset.PackageVersion, parent.PackageVersion);
  InheritString(preset.PackageDirectory, parent.PackageDirectory);
  InheritString(preset.VendorName, parent.VendorName);

  return true;
}